

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

void __thiscall
QRhiSwapChainRenderTarget::QRhiSwapChainRenderTarget
          (QRhiSwapChainRenderTarget *this,QRhiImplementation *rhi,QRhiSwapChain *swapchain_)

{
  quint64 qVar1;
  
  (this->super_QRhiRenderTarget).super_QRhiResource.m_rhi = rhi;
  (this->super_QRhiRenderTarget).super_QRhiResource.m_objectName.d.d = (Data *)0x0;
  (this->super_QRhiRenderTarget).super_QRhiResource.m_objectName.d.ptr = (char *)0x0;
  (this->super_QRhiRenderTarget).super_QRhiResource.m_objectName.d.size = 0;
  LOCK();
  UNLOCK();
  qVar1 = (long)counter._q_value.super___atomic_base<unsigned_long_long>._M_i + 1;
  counter._q_value.super___atomic_base<unsigned_long_long>._M_i =
       (Type)(Type)((long)counter._q_value.super___atomic_base<unsigned_long_long>._M_i + 1);
  (this->super_QRhiRenderTarget).super_QRhiResource.m_id = qVar1;
  (this->super_QRhiRenderTarget).m_renderPassDesc = (QRhiRenderPassDescriptor *)0x0;
  (this->super_QRhiRenderTarget).super_QRhiResource._vptr_QRhiResource =
       (_func_int **)&PTR__QRhiResource_00784850;
  this->m_swapchain = swapchain_;
  return;
}

Assistant:

QRhiResource::QRhiResource(QRhiImplementation *rhi)
    : m_rhi(rhi)
{
    m_id = QRhiGlobalObjectIdGenerator::newId();
}